

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# webm2pes.cc
# Opt level: O2

bool libwebm::Webm2Pes::WritePesPacket(VideoFrame *frame,PacketDataBuffer *packet_data)

{
  _Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_> frame_00;
  pointer puVar1;
  ulong uVar2;
  pointer pRVar3;
  bool bVar4;
  bool bVar5;
  int64_t pts_90khz;
  ulong uVar6;
  char *pcVar7;
  uint8_t *raw_input;
  pointer pRVar8;
  size_t sVar9;
  size_t raw_input_length;
  size_t sStack_1b0;
  bool error;
  uint8_t uStack_19f;
  uint8_t uStack_19e;
  uint8_t uStack_19d;
  uint32_t local_19c;
  Ranges frame_ranges;
  PesHeader header;
  
  frame_00.super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl =
       (frame->buffer_).data._M_t.
       super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
       super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
       super__Head_base<0UL,_unsigned_char_*,_false>;
  if ((frame_00.super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl == (uchar *)0x0) ||
     (sVar9 = (frame->buffer_).length, sVar9 == 0)) {
    return false;
  }
  frame_ranges.super__Vector_base<libwebm::Range,_std::allocator<libwebm::Range>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  frame_ranges.super__Vector_base<libwebm::Range,_std::allocator<libwebm::Range>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  frame_ranges.super__Vector_base<libwebm::Range,_std::allocator<libwebm::Range>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  if (frame->codec_ == kVP9) {
    _error = (uint8_t  [4])((uint)_error & 0xffffff00);
    bVar4 = ParseVP9SuperFrameIndex
                      ((uint8_t *)
                       frame_00.super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl,sVar9,
                       &frame_ranges,&error);
    if (error != false) {
      fwrite("Webm2Pes: Superframe index parse failed.\n",0x29,1,_stderr);
      bVar4 = false;
LAB_0010d7b8:
      std::_Vector_base<libwebm::Range,_std::allocator<libwebm::Range>_>::~_Vector_base
                (&frame_ranges.super__Vector_base<libwebm::Range,_std::allocator<libwebm::Range>_>);
      return bVar4;
    }
    if (!bVar4) {
      header.optional_header.marker.bits = (frame->buffer_).length;
      header.start_code[0] = '\0';
      header.start_code[1] = '\0';
      header.start_code[2] = '\0';
      header.start_code[3] = '\0';
      header.packet_length = 0;
      header._6_2_ = 0;
      std::vector<libwebm::Range,_std::allocator<libwebm::Range>_>::emplace_back<libwebm::Range>
                (&frame_ranges,(Range *)&header);
    }
  }
  else {
    header.start_code[0] = '\0';
    header.start_code[1] = '\0';
    header.start_code[2] = '\0';
    header.start_code[3] = '\0';
    header.packet_length = 0;
    header._6_2_ = 0;
    header.optional_header.marker.bits = sVar9;
    std::vector<libwebm::Range,_std::allocator<libwebm::Range>_>::emplace_back<libwebm::Range>
              (&frame_ranges,(Range *)&header);
  }
  pts_90khz = NanosecondsTo90KhzTicks(frame->nanosecond_pts_);
  PesHeader::PesHeader(&header);
  PesOptionalHeader::SetPtsBits(&header.optional_header,pts_90khz);
  pRVar3 = frame_ranges.super__Vector_base<libwebm::Range,_std::allocator<libwebm::Range>_>._M_impl.
           super__Vector_impl_data._M_finish;
  puVar1 = (packet_data->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if ((packet_data->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
      super__Vector_impl_data._M_finish != puVar1) {
    (packet_data->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
    super__Vector_impl_data._M_finish = puVar1;
  }
  pRVar8 = frame_ranges.super__Vector_base<libwebm::Range,_std::allocator<libwebm::Range>_>._M_impl.
           super__Vector_impl_data._M_start;
LAB_0010d682:
  bVar4 = pRVar8 == pRVar3;
  if (!bVar4) {
    uVar2 = pRVar8->length;
    uVar6 = uVar2 - 0x8000;
    if (uVar2 < 0x8000) {
      uVar6 = 0;
    }
    if ((frame->buffer_).length < pRVar8->offset + uVar2) {
      pcVar7 = "Webm2Pes: Invalid frame length.\n";
      sStack_1b0 = 0x20;
    }
    else {
      header.packet_length = ((short)uVar2 - (short)uVar6) + 10;
      bVar5 = PesHeader::Write(&header,true,packet_data);
      if (bVar5) {
        local_19c = (uint32_t)pRVar8->length;
        error = true;
        uStack_19f = 'C';
        uStack_19e = 'M';
        uStack_19d = 'V';
        bVar5 = BCMVHeader::Write((BCMVHeader *)&error,packet_data);
        if (bVar5) {
          raw_input = (uint8_t *)
                      ((long)(frame->buffer_).data._M_t.
                             super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>
                             .super__Head_base<0UL,_unsigned_char_*,_false> + pRVar8->offset);
          sVar9 = pRVar8->length - uVar6;
          bVar5 = CopyAndEscapeStartCodes(raw_input,sVar9,packet_data);
          do {
            if (bVar5 == false) {
              pcVar7 = "Webm2Pes: Payload write failed.\n";
              sStack_1b0 = 0x20;
LAB_0010d7aa:
              fwrite(pcVar7,sStack_1b0,1,_stderr);
              goto LAB_0010d7b8;
            }
            if (uVar6 == 0) goto LAB_0010d76f;
            raw_input_length = 0x8000;
            if (uVar6 < 0x8000) {
              raw_input_length = uVar6;
            }
            header.packet_length = (uint16_t)raw_input_length;
            bVar5 = PesHeader::Write(&header,false,packet_data);
            if (!bVar5) {
              pcVar7 = "Webm2pes: fragment write failed.\n";
              sStack_1b0 = 0x21;
              goto LAB_0010d7aa;
            }
            bVar5 = CopyAndEscapeStartCodes(raw_input + sVar9,raw_input_length,packet_data);
            uVar6 = uVar6 - raw_input_length;
            sVar9 = sVar9 + raw_input_length;
          } while( true );
        }
        pcVar7 = "Webm2Pes: BCMV write failed.\n";
        sStack_1b0 = 0x1d;
      }
      else {
        pcVar7 = "Webm2Pes: packet header write failed.\n";
        sStack_1b0 = 0x26;
      }
    }
    fwrite(pcVar7,sStack_1b0,1,_stderr);
  }
  goto LAB_0010d7b8;
LAB_0010d76f:
  pRVar8 = pRVar8 + 1;
  goto LAB_0010d682;
}

Assistant:

bool Webm2Pes::WritePesPacket(const VideoFrame& frame,
                              PacketDataBuffer* packet_data) {
  if (frame.buffer().data.get() == nullptr || frame.buffer().length < 1)
    return false;

  Ranges frame_ranges;
  if (frame.codec() == VideoFrame::kVP9) {
    bool error = false;
    const bool has_superframe_index =
        ParseVP9SuperFrameIndex(frame.buffer().data.get(),
                                frame.buffer().length, &frame_ranges, &error);
    if (error) {
      std::fprintf(stderr, "Webm2Pes: Superframe index parse failed.\n");
      return false;
    }
    if (has_superframe_index == false) {
      frame_ranges.push_back(Range(0, frame.buffer().length));
    }
  } else {
    frame_ranges.push_back(Range(0, frame.buffer().length));
  }

  const std::int64_t khz90_pts =
      NanosecondsTo90KhzTicks(frame.nanosecond_pts());
  PesHeader header;
  header.optional_header.SetPtsBits(khz90_pts);

  packet_data->clear();

  for (const Range& packet_payload_range : frame_ranges) {
    std::size_t extra_bytes = 0;
    if (packet_payload_range.length > kMaxPayloadSize) {
      extra_bytes = packet_payload_range.length - kMaxPayloadSize;
    }
    if (packet_payload_range.length + packet_payload_range.offset >
        frame.buffer().length) {
      std::fprintf(stderr, "Webm2Pes: Invalid frame length.\n");
      return false;
    }

    // First packet of new frame. Always include PTS and BCMV header.
    header.packet_length =
        packet_payload_range.length - extra_bytes + BCMVHeader::size();
    if (header.Write(true, packet_data) != true) {
      std::fprintf(stderr, "Webm2Pes: packet header write failed.\n");
      return false;
    }

    BCMVHeader bcmv_header(static_cast<uint32_t>(packet_payload_range.length));
    if (bcmv_header.Write(packet_data) != true) {
      std::fprintf(stderr, "Webm2Pes: BCMV write failed.\n");
      return false;
    }

    // Insert the payload at the end of |packet_data|.
    const std::uint8_t* const payload_start =
        frame.buffer().data.get() + packet_payload_range.offset;

    const std::size_t bytes_to_copy = packet_payload_range.length - extra_bytes;
    if (CopyAndEscapeStartCodes(payload_start, bytes_to_copy, packet_data) ==
        false) {
      fprintf(stderr, "Webm2Pes: Payload write failed.\n");
      return false;
    }

    std::size_t bytes_copied = bytes_to_copy;
    while (extra_bytes) {
      // Write PES packets for the remaining data, but omit the PTS and BCMV
      // header.
      const std::size_t extra_bytes_to_copy =
          std::min(kMaxPayloadSize, extra_bytes);
      extra_bytes -= extra_bytes_to_copy;
      header.packet_length = extra_bytes_to_copy;
      if (header.Write(false, packet_data) != true) {
        fprintf(stderr, "Webm2pes: fragment write failed.\n");
        return false;
      }

      const std::uint8_t* fragment_start = payload_start + bytes_copied;
      if (CopyAndEscapeStartCodes(fragment_start, extra_bytes_to_copy,
                                  packet_data) == false) {
        fprintf(stderr, "Webm2Pes: Payload write failed.\n");
        return false;
      }

      bytes_copied += extra_bytes_to_copy;
    }
  }

  return true;
}